

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlerRegistration.h
# Opt level: O0

void registerHandlers(MessageHandler *messageHandler)

{
  RequestHandler *pRVar1;
  NotificationHandler *pNVar2;
  MessageHandler *messageHandler_local;
  
  pRVar1 = (RequestHandler *)operator_new(0x18);
  InitializeHandler::InitializeHandler((InitializeHandler *)pRVar1);
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pNVar2 = (NotificationHandler *)operator_new(0x18);
  FileChangeHandler::FileChangeHandler((FileChangeHandler *)pNVar2);
  MessageHandler::registerHandler(messageHandler,pNVar2);
  pNVar2 = (NotificationHandler *)operator_new(0x18);
  FileOpenHandler::FileOpenHandler((FileOpenHandler *)pNVar2);
  MessageHandler::registerHandler(messageHandler,pNVar2);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  OutlineHandler::OutlineHandler((OutlineHandler *)pRVar1);
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  ShutDownHandler::ShutDownHandler((ShutDownHandler *)pRVar1);
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  CompletionProvider::CompletionProvider((CompletionProvider *)pRVar1);
  MessageHandler::registerHandler(messageHandler,pRVar1);
  return;
}

Assistant:

void registerHandlers (MessageHandler *messageHandler) {
    messageHandler->registerHandler(new InitializeHandler());
    messageHandler->registerHandler(new FileChangeHandler());
    messageHandler->registerHandler(new FileOpenHandler());
    messageHandler->registerHandler(new OutlineHandler());
    messageHandler->registerHandler(new ShutDownHandler());
    messageHandler->registerHandler(new CompletionProvider());
}